

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O2

int anon_unknown.dwarf_3d90f::xAccess(sqlite3_vfs *param_1,char *zName,int flags,int *pResOut)

{
  byte bVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView local_48;
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *pResOut = 0;
  local_20 = zName;
  if ((flags & 0xfffffffdU) == 0) {
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_48,&local_20);
    QVar2.m_data = (storage_type_conflict *)local_48.m_size;
    QVar2.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar2);
    bVar1 = QFile::exists((QString *)&local_38);
    *pResOut = (uint)bVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int xAccess(sqlite3_vfs */*svfs*/, const char *zName, int flags, int *pResOut)
{
    *pResOut = 0;
    switch (flags) {
    case SQLITE_ACCESS_EXISTS:
    case SQLITE_ACCESS_READ:
        *pResOut = QFile::exists(QString::fromUtf8(zName));
        break;
    default:
        break;
    }
    return SQLITE_OK;
}